

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,false,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  sel_t sVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  
  if (count + 0x3f < 0x40) {
    lVar13 = 0;
  }
  else {
    puVar4 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar13 = 0;
    uVar15 = 0;
    uVar16 = 0;
    do {
      uVar14 = uVar15;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar20 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar20 = count;
        }
LAB_00ed9fab:
        if (uVar15 < uVar20) {
          psVar5 = sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          uVar18 = uVar15 << 4 | 8;
          do {
            uVar14 = uVar15;
            if (psVar5 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar5[uVar15];
            }
            iVar1 = *(int *)((long)ldata + (uVar18 - 8));
            iVar2 = *(int *)((long)rdata + (uVar18 - 8));
            iVar3 = *(int *)((long)ldata + (uVar18 - 4));
            iVar12 = *(int *)((long)rdata + (uVar18 - 4));
            lVar7 = *(long *)((long)&ldata->months + uVar18);
            lVar8 = *(long *)((long)&rdata->months + uVar18);
            if ((iVar12 == iVar3 && iVar2 == iVar1) && (iVar12 = iVar3, lVar7 == lVar8)) {
              uVar9 = 0;
            }
            else {
              lVar11 = (long)iVar3 + lVar7 / 86400000000;
              lVar17 = (long)iVar12 + lVar8 / 86400000000;
              uVar9 = 1;
              if (((long)iVar1 + lVar11 / 0x1e == (long)iVar2 + lVar17 / 0x1e) &&
                 (lVar11 % 0x1e == lVar17 % 0x1e)) {
                uVar9 = (ulong)(lVar7 % 86400000000 != lVar8 % 86400000000);
              }
            }
            psVar6[lVar13] = (sel_t)uVar14;
            lVar13 = uVar9 + lVar13;
            uVar15 = uVar15 + 1;
            uVar18 = uVar18 + 0x10;
            uVar14 = uVar20;
          } while (uVar20 != uVar15);
        }
      }
      else {
        uVar18 = puVar4[uVar16];
        uVar20 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar20 = count;
        }
        if (uVar18 == 0xffffffffffffffff) goto LAB_00ed9fab;
        if (uVar18 == 0) {
          uVar14 = uVar20;
          if (uVar15 < uVar20) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            do {
              sVar10 = (sel_t)uVar15;
              if (psVar5 != (sel_t *)0x0) {
                sVar10 = psVar5[uVar15];
              }
              psVar6[lVar13] = sVar10;
              lVar13 = lVar13 + 1;
              uVar15 = uVar15 + 1;
            } while (uVar20 != uVar15);
          }
        }
        else if (uVar15 < uVar20) {
          psVar5 = sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          uVar9 = uVar15 << 4 | 8;
          uVar19 = 0;
          do {
            if (psVar5 == (sel_t *)0x0) {
              sVar10 = (int)uVar15 + (int)uVar19;
            }
            else {
              sVar10 = psVar5[uVar15 + uVar19];
            }
            uVar14 = 1;
            if ((uVar18 >> (uVar19 & 0x3f) & 1) != 0) {
              iVar1 = *(int *)((long)ldata + (uVar9 - 8));
              iVar2 = *(int *)((long)rdata + (uVar9 - 8));
              iVar3 = *(int *)((long)ldata + (uVar9 - 4));
              iVar12 = *(int *)((long)rdata + (uVar9 - 4));
              lVar7 = *(long *)((long)&ldata->months + uVar9);
              lVar8 = *(long *)((long)&rdata->months + uVar9);
              if ((iVar12 == iVar3 && iVar2 == iVar1) && (iVar12 = iVar3, lVar7 == lVar8)) {
                uVar14 = 0;
              }
              else {
                lVar11 = (long)iVar3 + lVar7 / 86400000000;
                lVar17 = (long)iVar12 + lVar8 / 86400000000;
                if (((long)iVar1 + lVar11 / 0x1e == (long)iVar2 + lVar17 / 0x1e) &&
                   (lVar11 % 0x1e == lVar17 % 0x1e)) {
                  uVar14 = (ulong)(lVar7 % 86400000000 != lVar8 % 86400000000);
                }
              }
            }
            psVar6[lVar13] = sVar10;
            lVar13 = uVar14 + lVar13;
            uVar19 = uVar19 + 1;
            uVar9 = uVar9 + 0x10;
            uVar14 = uVar20;
          } while (uVar20 - uVar15 != uVar19);
        }
      }
      uVar15 = uVar14;
      uVar16 = uVar16 + 1;
    } while (uVar16 != count + 0x3f >> 6);
  }
  return count - lVar13;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}